

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_OneofInequalityTest_Test::TestBody
          (MessageDifferencerTest_OneofInequalityTest_Test *this)

{
  bool bVar1;
  pointer *__ptr;
  char *in_R9;
  AssertionResult gtest_ar_;
  TestOneof2 msg2;
  TestOneof2 msg1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d0;
  AssertHelper local_c8;
  internal local_c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  string local_b0;
  TestOneof2 local_90;
  TestOneof2 local_50;
  
  proto2_unittest::TestOneof2::TestOneof2(&local_50,(Arena *)0x0);
  proto2_unittest::TestOneof2::TestOneof2(&local_90,(Arena *)0x0);
  TestUtil::SetOneof1<proto2_unittest::TestOneof2>(&local_50);
  TestUtil::SetOneof2<proto2_unittest::TestOneof2>(&local_90);
  bVar1 = util::MessageDifferencer::Equals(&local_50.super_Message,&local_90.super_Message);
  local_c0[0] = (internal)!bVar1;
  local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,local_c0,(AssertionResult *)"util::MessageDifferencer::Equals(msg1, msg2)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x4c4,local_b0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (local_d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d0._M_head_impl + 8))();
    }
  }
  if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b8,local_b8);
  }
  proto2_unittest::TestOneof2::~TestOneof2(&local_90);
  proto2_unittest::TestOneof2::~TestOneof2(&local_50);
  return;
}

Assistant:

TEST(MessageDifferencerTest, OneofInequalityTest) {
  // Create the testing protos
  unittest::TestOneof2 msg1;
  unittest::TestOneof2 msg2;

  TestUtil::SetOneof1(&msg1);
  TestUtil::SetOneof2(&msg2);

  // Compare
  EXPECT_FALSE(util::MessageDifferencer::Equals(msg1, msg2));
}